

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlyphBoundaries.cpp
# Opt level: O0

int __thiscall
GlyphBoundaries::OutputGlatSubBox
          (GlyphBoundaries *this,GrcBinaryStream *pbstrm,int icellX,int icellY)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int in_ECX;
  int in_EDX;
  GlyphBoundaries *in_RDI;
  int sDPMax;
  int sDPMin;
  int sDNMax;
  int sDNMin;
  int sTop;
  int sBottom;
  int sRight;
  int sLeft;
  GlyphBoundaryCell *pgbcell;
  int in_stack_ffffffffffffff6c;
  GlyphBoundaryCell *this_00;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  GlyphBoundaryCell *local_28;
  int local_4;
  
  this_00 = in_RDI->m_rggbcellSub;
  iVar2 = CellIndex(in_RDI,in_EDX,in_ECX);
  local_28 = this_00 + iVar2;
  bVar1 = GlyphBoundaryCell::HasData(local_28);
  if (bVar1) {
    local_30 = (int)(local_28->m_dValues[0] * 255.0);
    local_34 = 0xff;
    piVar3 = std::min<int>(&local_30,&local_34);
    local_2c = *piVar3;
    local_3c = (int)(local_28->m_dValues[1] * 255.0);
    local_40 = 0xff;
    piVar3 = std::min<int>(&local_3c,&local_40);
    local_38 = *piVar3;
    local_48 = (int)(local_28->m_dValues[2] * 255.0);
    local_4c = 0xff;
    piVar3 = std::min<int>(&local_48,&local_4c);
    local_44 = *piVar3;
    local_54 = (int)(local_28->m_dValues[3] * 255.0);
    local_58 = 0xff;
    piVar3 = std::min<int>(&local_54,&local_58);
    local_50 = *piVar3;
    local_60 = (int)(local_28->m_dValues[6] * 255.0);
    local_64 = 0xff;
    piVar3 = std::min<int>(&local_60,&local_64);
    local_5c = *piVar3;
    local_6c = (int)(local_28->m_dValues[7] * 255.0);
    local_70 = 0xff;
    piVar3 = std::min<int>(&local_6c,&local_70);
    local_68 = *piVar3;
    local_78 = (int)(local_28->m_dValues[4] * 255.0);
    local_7c = 0xff;
    piVar3 = std::min<int>(&local_78,&local_7c);
    local_74 = *piVar3;
    local_84 = (int)(local_28->m_dValues[5] * 255.0);
    local_88 = 0xff;
    piVar3 = std::min<int>(&local_84,&local_88);
    local_80 = *piVar3;
    GrcBinaryStream::WriteByte<int>((GrcBinaryStream *)this_00,in_stack_ffffffffffffff6c);
    GrcBinaryStream::WriteByte<int>((GrcBinaryStream *)this_00,in_stack_ffffffffffffff6c);
    GrcBinaryStream::WriteByte<int>((GrcBinaryStream *)this_00,in_stack_ffffffffffffff6c);
    GrcBinaryStream::WriteByte<int>((GrcBinaryStream *)this_00,in_stack_ffffffffffffff6c);
    GrcBinaryStream::WriteByte<int>((GrcBinaryStream *)this_00,in_stack_ffffffffffffff6c);
    GrcBinaryStream::WriteByte<int>((GrcBinaryStream *)this_00,in_stack_ffffffffffffff6c);
    GrcBinaryStream::WriteByte<int>((GrcBinaryStream *)this_00,in_stack_ffffffffffffff6c);
    GrcBinaryStream::WriteByte<int>((GrcBinaryStream *)this_00,in_stack_ffffffffffffff6c);
    local_4 = 8;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int GlyphBoundaries::OutputGlatSubBox(GrcBinaryStream * pbstrm, int icellX, int icellY)
{
	GlyphBoundaryCell * pgbcell = m_rggbcellSub + CellIndex(icellX, icellY);

	if (pgbcell->HasData())
	{
		Assert(pgbcell->m_dValues[gbcLeft]  >= 0);
		Assert(pgbcell->m_dValues[gbcRight] >= 0);
		Assert(pgbcell->m_dValues[gbcBottom]>= 0);
		Assert(pgbcell->m_dValues[gbcTop]   >= 0);
		Assert(pgbcell->m_dValues[gbcDNMin] >= 0);
		Assert(pgbcell->m_dValues[gbcDNMax] >= 0);
		Assert(pgbcell->m_dValues[gbcDPMin] >= 0);
		Assert(pgbcell->m_dValues[gbcDPMax] >= 0);
		Assert(pgbcell->m_dValues[gbcLeft]  <= 1.0);
		Assert(pgbcell->m_dValues[gbcRight] <= 1.0);
		Assert(pgbcell->m_dValues[gbcBottom]<= 1.0);
		Assert(pgbcell->m_dValues[gbcTop]   <= 1.0);
		Assert(pgbcell->m_dValues[gbcDNMin] <= 1.0);
		Assert(pgbcell->m_dValues[gbcDNMax] <= 1.0);
		Assert(pgbcell->m_dValues[gbcDPMin] <= 1.0);
		Assert(pgbcell->m_dValues[gbcDPMax] <= 1.0);

		// The possible range for horizontal and vertical boundaries is [0 .. 1]. Scale them to [0 .. 255].
		int sLeft   = min(int(pgbcell->m_dValues[gbcLeft]   * 255), 255);
		int sRight  = min(int(pgbcell->m_dValues[gbcRight]  * 255), 255);
		int sBottom = min(int(pgbcell->m_dValues[gbcBottom] * 255), 255);
		int sTop    = min(int(pgbcell->m_dValues[gbcTop]    * 255), 255);

		// The possible range for diagonals is [0 .. 1]. Scale them to [0 .. 255].
		int sDNMin = min(int(pgbcell->m_dValues[gbcDNMin] * 255), 255);
		int sDNMax = min(int(pgbcell->m_dValues[gbcDNMax] * 255), 255);
		int sDPMin = min(int(pgbcell->m_dValues[gbcDPMin] * 255), 255);
		int sDPMax = min(int(pgbcell->m_dValues[gbcDPMax] * 255), 255);

		pbstrm->WriteByte(sLeft);
		pbstrm->WriteByte(sRight);
		pbstrm->WriteByte(sBottom);
		pbstrm->WriteByte(sTop);

		pbstrm->WriteByte(sDNMin);
		pbstrm->WriteByte(sDNMax);
		pbstrm->WriteByte(sDPMin);
		pbstrm->WriteByte(sDPMax);

		return 8;
	}
	else
		return 0;
}